

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O0

void __thiscall CVmImageWriter::begin_srcf_block(CVmImageWriter *this,int count)

{
  undefined4 in_ESI;
  undefined8 in_RDI;
  int unaff_retaddr;
  undefined4 in_stack_00000008;
  uint v;
  undefined4 in_stack_fffffffffffffff0;
  
  v = (uint)((ulong)in_RDI >> 0x20);
  begin_block(this,(char *)CONCAT44(count,in_stack_00000008),unaff_retaddr);
  CVmFile::write_uint2((CVmFile *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),v);
  CVmFile::write_uint2((CVmFile *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),v);
  return;
}

Assistant:

void CVmImageWriter::begin_srcf_block(int count)
{
    /* 
     *   begin the block - SRCF blocks are always optional, since they're
     *   purely for debugging purposes 
     */
    begin_block("SRCF", FALSE);

    /* write the number of entries */
    fp_->write_uint2(count);

    /* each source line record is 8 bytes in the current format */
    fp_->write_uint2(8);
}